

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O2

int deal(int signal,double *income,double *balance,double pr)

{
  int iVar1;
  ostream *poVar2;
  
  if (signal == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Here is the refund:");
    poVar2 = std::ostream::_M_insert<double>(*income);
    poVar2 = std::operator<<(poVar2,"yuan.");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"back");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    *income = 0.0;
    buttonback();
    iVar1 = -1;
  }
  else {
    if (signal == 0) {
      *balance = *balance - (*income - pr);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<((ostream *)&std::cout,"Here is the charge: ");
      poVar2 = std::ostream::_M_insert<double>(*income - pr);
      poVar2 = std::operator<<(poVar2," yuan.");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"back");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      *balance = *balance + *income;
      *income = 0.0;
      buttonback();
    }
    else {
      *balance = *balance + *income;
      *income = 0.0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int deal(int signal, double &income, double &balance, double pr) {
    int isok;
    switch (signal) {
        case 1:
            balance = balance + income;
            income = 0;
            isok = 0;
            break;
        case 0:
            balance = balance - (income - pr);
            frame
            cout << "Here is the charge: " << income - pr << " yuan." << endl;
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            frame
            balance = balance + income;
            income = 0;
            isok = 0;
            buttonback();
            break;
        case -1:
            frame
            cout << "Here is the refund:" << income << "yuan." << endl;
            cout << endl << endl << "back" << endl;
            frame
            income = 0;
            isok = -1;
            buttonback();
            break;
    }
    return isok;
}